

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

char * SpellcheckStringV(string *text,vector<const_char_*,_std::allocator<const_char_*>_> *words)

{
  int iVar1;
  int iVar2;
  pointer ppcVar3;
  char *pcVar4;
  StringPiece local_50;
  StringPiece local_40;
  
  iVar2 = 4;
  pcVar4 = (char *)0x0;
  for (ppcVar3 = (words->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar3 !=
      (words->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
    local_40.str_ = *ppcVar3;
    local_40.len_ = strlen(local_40.str_);
    local_50.str_ = (text->_M_dataplus)._M_p;
    local_50.len_ = text->_M_string_length;
    iVar1 = EditDistance(&local_40,&local_50,true,3);
    if (iVar1 < iVar2) {
      pcVar4 = *ppcVar3;
      iVar2 = iVar1;
    }
  }
  return pcVar4;
}

Assistant:

const char* SpellcheckStringV(const string& text,
                              const vector<const char*>& words) {
  const bool kAllowReplacements = true;
  const int kMaxValidEditDistance = 3;

  int min_distance = kMaxValidEditDistance + 1;
  const char* result = NULL;
  for (vector<const char*>::const_iterator i = words.begin();
       i != words.end(); ++i) {
    int distance = EditDistance(*i, text, kAllowReplacements,
                                kMaxValidEditDistance);
    if (distance < min_distance) {
      min_distance = distance;
      result = *i;
    }
  }
  return result;
}